

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O0

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<8,_9,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  float s;
  VecAccess<float,_4,_3> local_70;
  Vector<float,_3> local_48;
  undefined1 local_3c [8];
  Type in0;
  InputType in1Type_local;
  InputType in0Type_local;
  ShaderEvalContext *evalCtx_local;
  
  in0.m_data.m_data[2].m_data[1] = (float)in1Type;
  in0.m_data.m_data[2].m_data[2] = (float)in0Type;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    getInputValue<2,9>((Mat3 *)local_3c,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
  }
  else {
    getInputValue<0,9>((Mat3 *)local_3c,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
  }
  s = determinant<3>((Matrix<float,_3,_3> *)local_3c);
  tcu::Vector<float,_3>::Vector(&local_48,s);
  tcu::Vector<float,_4>::xyz(&local_70,&evalCtx->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_70,&local_48);
  tcu::Matrix<float,_3,_3>::~Matrix((Matrix<float,_3,_3> *)local_3c);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = Vec3(determinant(in0));
	}